

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::addRotationTarget
          (InverseKinematics *this,string *frameName,Rotation *constraintValue,double rotationWeight
          )

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return false;
}

Assistant:

bool InverseKinematics::addRotationTarget(const std::string& frameName, const iDynTree::Rotation& constraintValue, const double rotationWeight)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->addTarget(internal::kinematics::TransformConstraint::rotationConstraint(frameName,  constraintValue, rotationWeight));
#else
        return missingIpoptErrorReport();
#endif
    }